

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O3

void av1_alloc_txb_buf(AV1_COMP *cpi)

{
  byte bVar1;
  SequenceHeader *pSVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  CB_COEFF_BUFFER *pCVar5;
  tran_low_t *ptVar6;
  uint16_t *puVar7;
  uint8_t *puVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  bool bVar20;
  
  pSVar2 = (cpi->common).seq_params;
  bVar1 = (byte)pSVar2->mib_size_log2;
  uVar14 = ~(-1 << (bVar1 & 0x1f));
  iVar15 = ((int)(uVar14 + (cpi->common).mi_params.mi_cols) >> (bVar1 & 0x1f)) *
           ((int)((cpi->common).mi_params.mi_rows + uVar14) >> (bVar1 & 0x1f));
  bVar20 = pSVar2->monochrome == '\0';
  iVar9 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[pSVar2->sb_size] & 0x1f
               );
  iVar18 = iVar9 >> ((char)pSVar2->subsampling_y + (char)pSVar2->subsampling_x & 0x1fU);
  uVar13 = (ulong)iVar15;
  uVar17 = (ulong)(int)((uint)bVar20 * 2 * iVar18 + iVar9);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar17;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar13;
  if (SUB168(auVar3 * auVar4,8) != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_ERROR,"A multiplication would overflow size_t")
    ;
  }
  uVar17 = uVar17 * uVar13;
  av1_free_txb_buf(cpi);
  pCVar5 = (CB_COEFF_BUFFER *)aom_malloc(uVar13 * 0x48);
  cpi->coeff_buffer_base = pCVar5;
  if (pCVar5 == (CB_COEFF_BUFFER *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cpi->coeff_buffer_base");
  }
  if (uVar17 >> 0x3e != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_ERROR,"A multiplication would overflow size_t")
    ;
  }
  ptVar6 = (tran_low_t *)aom_memalign(0x20,uVar17 * 4);
  (cpi->coeff_buffer_pool).tcoeff = ptVar6;
  if (ptVar6 == (tran_low_t *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate coeff_buf_pool->tcoeff");
  }
  if ((long)uVar17 < 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_ERROR,"A multiplication would overflow size_t")
    ;
  }
  puVar7 = (uint16_t *)aom_malloc(uVar17 >> 3 & 0xfffffffffffffff);
  (cpi->coeff_buffer_pool).eobs = puVar7;
  if (puVar7 == (uint16_t *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate coeff_buf_pool->eobs");
  }
  puVar8 = (uint8_t *)aom_malloc(uVar17 >> 4);
  (cpi->coeff_buffer_pool).entropy_ctx = puVar8;
  if (puVar8 == (uint8_t *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate coeff_buf_pool->entropy_ctx");
    puVar8 = (cpi->coeff_buffer_pool).entropy_ctx;
  }
  if (0 < iVar15) {
    ptVar6 = (cpi->coeff_buffer_pool).tcoeff;
    puVar7 = (cpi->coeff_buffer_pool).eobs;
    lVar10 = 0;
    uVar17 = 0;
    do {
      lVar12 = 0;
      lVar11 = lVar10;
      do {
        bVar19 = lVar12 == 0;
        lVar12 = lVar12 + -1;
        iVar15 = iVar18;
        if (bVar19) {
          iVar15 = iVar9;
        }
        *(tran_low_t **)((long)cpi->coeff_buffer_base->tcoeff + lVar11) = ptVar6;
        *(uint16_t **)((long)cpi->coeff_buffer_base->eobs + lVar11) = puVar7;
        *(uint8_t **)((long)cpi->coeff_buffer_base->entropy_ctx + lVar11) = puVar8;
        ptVar6 = ptVar6 + iVar15;
        iVar16 = iVar15 + 0xf;
        if (-1 < iVar15) {
          iVar16 = iVar15;
        }
        puVar7 = puVar7 + (iVar16 >> 4);
        puVar8 = puVar8 + (iVar16 >> 4);
        lVar11 = lVar11 + 8;
      } while (-lVar12 != (ulong)((uint)bVar20 * 2 + 1));
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 0x48;
    } while (uVar17 != uVar13);
  }
  return;
}

Assistant:

void av1_alloc_txb_buf(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CoeffBufferPool *coeff_buf_pool = &cpi->coeff_buffer_pool;
  const int num_sb_rows =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, cm->seq_params->mib_size_log2);
  const int num_sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, cm->seq_params->mib_size_log2);
  const int size = num_sb_rows * num_sb_cols;
  const int num_planes = av1_num_planes(cm);
  const int subsampling_x = cm->seq_params->subsampling_x;
  const int subsampling_y = cm->seq_params->subsampling_y;
  const int luma_max_sb_square =
      1 << num_pels_log2_lookup[cm->seq_params->sb_size];
  const int chroma_max_sb_square =
      luma_max_sb_square >> (subsampling_x + subsampling_y);
  const int total_max_sb_square =
      (luma_max_sb_square + (num_planes - 1) * chroma_max_sb_square);
  if ((size_t)size > SIZE_MAX / (size_t)total_max_sb_square) {
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  const size_t num_tcoeffs = (size_t)size * (size_t)total_max_sb_square;
  const int txb_unit_size = TX_SIZE_W_MIN * TX_SIZE_H_MIN;

  av1_free_txb_buf(cpi);
  // TODO(jingning): This should be further reduced.
  CHECK_MEM_ERROR(cm, cpi->coeff_buffer_base,
                  aom_malloc(sizeof(*cpi->coeff_buffer_base) * size));
  if (sizeof(*coeff_buf_pool->tcoeff) > SIZE_MAX / num_tcoeffs) {
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  CHECK_MEM_ERROR(
      cm, coeff_buf_pool->tcoeff,
      aom_memalign(32, sizeof(*coeff_buf_pool->tcoeff) * num_tcoeffs));
  if (sizeof(*coeff_buf_pool->eobs) > SIZE_MAX / num_tcoeffs) {
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  CHECK_MEM_ERROR(
      cm, coeff_buf_pool->eobs,
      aom_malloc(sizeof(*coeff_buf_pool->eobs) * num_tcoeffs / txb_unit_size));
  if (sizeof(*coeff_buf_pool->entropy_ctx) > SIZE_MAX / num_tcoeffs) {
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "A multiplication would overflow size_t");
  }
  CHECK_MEM_ERROR(cm, coeff_buf_pool->entropy_ctx,
                  aom_malloc(sizeof(*coeff_buf_pool->entropy_ctx) *
                             num_tcoeffs / txb_unit_size));

  tran_low_t *tcoeff_ptr = coeff_buf_pool->tcoeff;
  uint16_t *eob_ptr = coeff_buf_pool->eobs;
  uint8_t *entropy_ctx_ptr = coeff_buf_pool->entropy_ctx;
  for (int i = 0; i < size; i++) {
    for (int plane = 0; plane < num_planes; plane++) {
      const int max_sb_square =
          (plane == AOM_PLANE_Y) ? luma_max_sb_square : chroma_max_sb_square;
      cpi->coeff_buffer_base[i].tcoeff[plane] = tcoeff_ptr;
      cpi->coeff_buffer_base[i].eobs[plane] = eob_ptr;
      cpi->coeff_buffer_base[i].entropy_ctx[plane] = entropy_ctx_ptr;
      tcoeff_ptr += max_sb_square;
      eob_ptr += max_sb_square / txb_unit_size;
      entropy_ctx_ptr += max_sb_square / txb_unit_size;
    }
  }
}